

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

uint8_t * protozero::proto_utils::WriteVarInt<perfetto::protos::pbzero::TrackEvent_Type>
                    (TrackEvent_Type value,uint8_t *target)

{
  undefined8 local_28;
  UnsignedType unsigned_value;
  MaybeExtendedType extended_value;
  uint8_t *target_local;
  TrackEvent_Type value_local;
  
  extended_value = (MaybeExtendedType)target;
  for (local_28 = (ulong)(int)value; 0x7f < local_28; local_28 = local_28 >> 7) {
    *(byte *)extended_value = (byte)local_28 | 0x80;
    extended_value = extended_value + 1;
  }
  *(byte *)extended_value = (byte)local_28;
  return (uint8_t *)(extended_value + 1);
}

Assistant:

inline uint8_t* WriteVarInt(T value, uint8_t* target) {
  // If value is <= 0 we must first sign extend to int64_t (see [1]).
  // Finally we always cast to an unsigned value to to avoid arithmetic
  // (sign expanding) shifts in the while loop.
  // [1]: "If you use int32 or int64 as the type for a negative number, the
  // resulting varint is always ten bytes long".
  // - developers.google.com/protocol-buffers/docs/encoding
  // So for each input type we do the following casts:
  // uintX_t -> uintX_t -> uintX_t
  // int8_t  -> int64_t -> uint64_t
  // int16_t -> int64_t -> uint64_t
  // int32_t -> int64_t -> uint64_t
  // int64_t -> int64_t -> uint64_t
  using MaybeExtendedType =
      typename std::conditional<std::is_unsigned<T>::value, T, int64_t>::type;
  using UnsignedType = typename std::make_unsigned<MaybeExtendedType>::type;

  MaybeExtendedType extended_value = static_cast<MaybeExtendedType>(value);
  UnsignedType unsigned_value = static_cast<UnsignedType>(extended_value);

  while (unsigned_value >= 0x80) {
    *target++ = static_cast<uint8_t>(unsigned_value) | 0x80;
    unsigned_value >>= 7;
  }
  *target = static_cast<uint8_t>(unsigned_value);
  return target + 1;
}